

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-writer.cc
# Opt level: O0

bool tinyusdz::usda::SaveAsUSDA(string *filename,Stage *stage,string *warn,string *err)

{
  bool bVar1;
  uchar *contents;
  size_t content_bytes;
  ostream *poVar2;
  undefined1 local_50 [8];
  string s;
  string *err_local;
  string *warn_local;
  Stage *stage_local;
  string *filename_local;
  
  s.field_2._8_8_ = err;
  Stage::ExportToString_abi_cxx11_((string *)local_50,stage,false);
  contents = (uchar *)std::__cxx11::string::data();
  content_bytes = std::__cxx11::string::size();
  bVar1 = io::WriteWholeFile(filename,contents,content_bytes,(string *)s.field_2._8_8_);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Wrote to [");
    poVar2 = std::operator<<(poVar2,(string *)filename);
    std::operator<<(poVar2,"]\n");
  }
  std::__cxx11::string::~string((string *)local_50);
  return bVar1;
}

Assistant:

bool SaveAsUSDA(const std::string &filename, const Stage &stage,
                std::string *warn, std::string *err) {

  (void)warn;

  // TODO: Handle warn and err on export.
  std::string s = stage.ExportToString();

  if (!io::WriteWholeFile(filename, reinterpret_cast<const unsigned char *>(s.data()), s.size(), err)) {
    return false;
  }

  std::cout << "Wrote to [" << filename << "]\n";

  return true;
}